

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O0

void __thiscall re2::BitState::Push(BitState *this,int id,char *p,int arg)

{
  int iVar1;
  bool bVar2;
  InstOp IVar3;
  Inst *this_00;
  Job *pJVar4;
  Job *j;
  int op;
  int arg_local;
  char *p_local;
  int id_local;
  BitState *this_local;
  
  if ((this->njob_ < this->maxjob_) || (bVar2 = GrowStack(this), bVar2)) {
    this_00 = Prog::inst(this->prog_,id);
    IVar3 = Prog::Inst::opcode(this_00);
    if ((IVar3 != kInstFail) && ((arg != 0 || (bVar2 = ShouldVisit(this,id,p), bVar2)))) {
      iVar1 = this->njob_;
      this->njob_ = iVar1 + 1;
      pJVar4 = this->job_ + iVar1;
      pJVar4->id = id;
      pJVar4->p = p;
      pJVar4->arg = arg;
    }
  }
  return;
}

Assistant:

void BitState::Push(int id, const char* p, int arg) {
  if (njob_ >= maxjob_) {
    if (!GrowStack())
      return;
  }
  int op = prog_->inst(id)->opcode();
  if (op == kInstFail)
    return;

  // Only check ShouldVisit when arg == 0.
  // When arg > 0, we are continuing a previous visit.
  if (arg == 0 && !ShouldVisit(id, p))
    return;

  Job* j = &job_[njob_++];
  j->id = id;
  j->p = p;
  j->arg = arg;
}